

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O0

void gen_xvnmsubsp(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_ptr arg2;
  TCGv_ptr arg3;
  TCGv_ptr local_38;
  TCGv_ptr c;
  TCGv_ptr b;
  TCGv_ptr xa;
  TCGv_ptr xt;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (((ctx->vsx_enabled ^ 0xffU) & 1) == 0) {
    uVar1 = xT(ctx->opcode);
    arg2 = gen_vsr_ptr(tcg_ctx_00,uVar1);
    uVar1 = xA(ctx->opcode);
    arg3 = gen_vsr_ptr(tcg_ctx_00,uVar1);
    if ((ctx->opcode & 0x40) == 0) {
      uVar1 = xB(ctx->opcode);
      c = gen_vsr_ptr(tcg_ctx_00,uVar1);
      uVar1 = xT(ctx->opcode);
      local_38 = gen_vsr_ptr(tcg_ctx_00,uVar1);
    }
    else {
      uVar1 = xT(ctx->opcode);
      c = gen_vsr_ptr(tcg_ctx_00,uVar1);
      uVar1 = xB(ctx->opcode);
      local_38 = gen_vsr_ptr(tcg_ctx_00,uVar1);
    }
    gen_helper_xvnmsubsp(tcg_ctx_00,tcg_ctx_00->cpu_env,arg2,arg3,c,local_38);
    tcg_temp_free_ptr(tcg_ctx_00,arg2);
    tcg_temp_free_ptr(tcg_ctx_00,arg3);
    tcg_temp_free_ptr(tcg_ctx_00,c);
    tcg_temp_free_ptr(tcg_ctx_00,local_38);
  }
  else {
    gen_exception(ctx,0x5e);
  }
  return;
}

Assistant:

static void gen_xxbrd(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 xth;
    TCGv_i64 xtl;
    TCGv_i64 xbh;
    TCGv_i64 xbl;

    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    xth = tcg_temp_new_i64(tcg_ctx);
    xtl = tcg_temp_new_i64(tcg_ctx);
    xbh = tcg_temp_new_i64(tcg_ctx);
    xbl = tcg_temp_new_i64(tcg_ctx);
    get_cpu_vsrh(tcg_ctx, xbh, xB(ctx->opcode));
    get_cpu_vsrl(tcg_ctx, xbl, xB(ctx->opcode));

    tcg_gen_bswap64_i64(tcg_ctx, xth, xbh);
    tcg_gen_bswap64_i64(tcg_ctx, xtl, xbl);
    set_cpu_vsrh(tcg_ctx, xT(ctx->opcode), xth);
    set_cpu_vsrl(tcg_ctx, xT(ctx->opcode), xtl);

    tcg_temp_free_i64(tcg_ctx, xth);
    tcg_temp_free_i64(tcg_ctx, xtl);
    tcg_temp_free_i64(tcg_ctx, xbh);
    tcg_temp_free_i64(tcg_ctx, xbl);
}